

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_int_2_suite::test_two(void)

{
  undefined4 local_48;
  value_type_conflict1 local_44 [2];
  undefined4 local_3c;
  value_type_conflict1 local_38 [2];
  undefined1 local_30 [8];
  moment<int,_2> filter;
  
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push
            ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30,1);
  local_38[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::mean
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_3c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1b2,"void mean_int_2_suite::test_two()",local_38,&local_3c);
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push
            ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30,3);
  local_44[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::mean
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_48 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1b4,"void mean_int_2_suite::test_two()",local_44,&local_48);
  return;
}

Assistant:

void test_two()
{
    window::moment<int, 2> filter;
    filter.push(1);
    TRIAL_TEST_EQ(filter.mean(), 1);
    filter.push(3);
    TRIAL_TEST_EQ(filter.mean(), 2);
}